

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall
cmCTestScriptHandler::ReadInScript(cmCTestScriptHandler *this,string *total_script_arg)

{
  cmMakefile *pcVar1;
  cmCTest *this_00;
  bool bVar2;
  long lVar3;
  string *psVar4;
  ostream *poVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar6;
  _Base_ptr p_Var7;
  int iVar8;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string systemFile;
  string script;
  char *local_208 [4];
  string script_arg;
  ostringstream cmCTestLog_msg;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  cmSystemTools::s_FatalErrorOccurred = false;
  script._M_dataplus._M_p = (pointer)&script.field_2;
  script._M_string_length = 0;
  cmSystemTools::s_ErrorOccurred = false;
  script.field_2._M_local_buf[0] = '\0';
  script_arg._M_dataplus._M_p = (pointer)&script_arg.field_2;
  script_arg._M_string_length = 0;
  script_arg.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)total_script_arg,0x2c);
  if (lVar3 == -1) {
    std::__cxx11::string::_M_assign((string *)&script);
  }
  else {
    std::__cxx11::string::substr((ulong)&cmCTestLog_msg,(ulong)total_script_arg);
    std::__cxx11::string::operator=((string *)&script,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::substr((ulong)&cmCTestLog_msg,(ulong)total_script_arg);
    std::__cxx11::string::operator=((string *)&script_arg,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  bVar2 = cmsys::SystemTools::FileExists(&script);
  if (!bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"Cannot find file: ",&script);
    cmSystemTools::Error((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    iVar8 = 1;
    goto LAB_00489fff;
  }
  CreateCMake(this);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_SCRIPT_DIRECTORY",(allocator<char> *)local_208);
  cmsys::SystemTools::GetFilenamePath(&systemFile,&script);
  value._M_str = systemFile._M_dataplus._M_p;
  value._M_len = systemFile._M_string_length;
  cmMakefile::AddDefinition(pcVar1,(string *)&cmCTestLog_msg,value);
  std::__cxx11::string::~string((string *)&systemFile);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_SCRIPT_NAME",(allocator<char> *)local_208);
  cmsys::SystemTools::GetFilenameName(&systemFile,&script);
  value_00._M_str = systemFile._M_dataplus._M_p;
  value_00._M_len = systemFile._M_string_length;
  cmMakefile::AddDefinition(pcVar1,(string *)&cmCTestLog_msg,value_00);
  std::__cxx11::string::~string((string *)&systemFile);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_EXECUTABLE_NAME",(allocator<char> *)&systemFile);
  psVar4 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  value_01._M_str = (psVar4->_M_dataplus)._M_p;
  value_01._M_len = psVar4->_M_string_length;
  cmMakefile::AddDefinition(pcVar1,(string *)&cmCTestLog_msg,value_01);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CMAKE_EXECUTABLE_NAME",(allocator<char> *)&systemFile);
  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  value_02._M_str = (psVar4->_M_dataplus)._M_p;
  value_02._M_len = psVar4->_M_string_length;
  cmMakefile::AddDefinition(pcVar1,(string *)&cmCTestLog_msg,value_02);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_RUN_CURRENT_SCRIPT",(allocator<char> *)&systemFile);
  cmMakefile::AddDefinitionBool(pcVar1,(string *)&cmCTestLog_msg,true);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  this->ShouldRunCurrentScript = true;
  UpdateElapsedTime(this);
  psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if (psVar4->_M_string_length != 0) {
    pcVar1 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_CONFIGURATION_TYPE",(allocator<char> *)&systemFile);
    psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    value_03._M_str = (psVar4->_M_dataplus)._M_p;
    value_03._M_len = psVar4->_M_string_length;
    cmMakefile::AddDefinition(pcVar1,(string *)&cmCTestLog_msg,value_03);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if (script_arg._M_string_length != 0) {
    pcVar1 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"CTEST_SCRIPT_ARG",(allocator<char> *)&systemFile);
    value_04._M_str = script_arg._M_dataplus._M_p;
    value_04._M_len = script_arg._M_string_length;
    cmMakefile::AddDefinition(pcVar1,(string *)&cmCTestLog_msg,value_04);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:334:36)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:334:36)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  cmMakefile::OnExecuteCommand
            ((this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(function<void_()> *)&local_50)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  pcVar1 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTestScriptMode.cmake",(allocator<char> *)local_208);
  cmMakefile::GetModulesFile(&systemFile,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  bVar2 = cmMakefile::ReadListFile
                    ((this->Makefile)._M_t.
                     super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                     super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&systemFile);
  if (bVar2) {
    bVar2 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar2) goto LAB_00489f35;
    pmVar6 = cmCTest::GetDefinitions_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    for (p_Var7 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      value_05._M_str = *(char **)(p_Var7 + 2);
      value_05._M_len = (size_t)p_Var7[2]._M_parent;
      cmMakefile::AddDefinition
                ((this->Makefile)._M_t.
                 super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                 super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                 super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(string *)(p_Var7 + 1),
                 value_05);
    }
    bVar2 = cmMakefile::ReadListFile
                      ((this->Makefile)._M_t.
                       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&script);
    if (!bVar2) {
LAB_0048a089:
      cmSystemTools::s_FatalErrorOccurred = false;
      cmSystemTools::s_ErrorOccurred = false;
      goto LAB_00489fbc;
    }
    bVar2 = cmSystemTools::GetErrorOccurredFlag();
    iVar8 = 0;
    if (bVar2) goto LAB_0048a089;
  }
  else {
LAB_00489f35:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Error in read:");
    poVar5 = std::operator<<(poVar5,(string *)&systemFile);
    std::operator<<(poVar5,"\n");
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x15a,local_208[0],false);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_00489fbc:
    iVar8 = 2;
  }
  std::__cxx11::string::~string((string *)&systemFile);
LAB_00489fff:
  std::__cxx11::string::~string((string *)&script_arg);
  std::__cxx11::string::~string((string *)&script);
  return iVar8;
}

Assistant:

int cmCTestScriptHandler::ReadInScript(const std::string& total_script_arg)
{
  // Reset the error flag so that the script is read in no matter what
  cmSystemTools::ResetErrorOccurredFlag();

  // if the argument has a , in it then it needs to be broken into the fist
  // argument (which is the script) and the second argument which will be
  // passed into the scripts as S_ARG
  std::string script;
  std::string script_arg;
  const std::string::size_type comma_pos = total_script_arg.find(',');
  if (comma_pos != std::string::npos) {
    script = total_script_arg.substr(0, comma_pos);
    script_arg = total_script_arg.substr(comma_pos + 1);
  } else {
    script = total_script_arg;
  }
  // make sure the file exists
  if (!cmSystemTools::FileExists(script)) {
    cmSystemTools::Error("Cannot find file: " + script);
    return 1;
  }

  // read in the list file to fill the cache
  // create a cmake instance to read the configuration script
  this->CreateCMake();

  // set a variable with the path to the current script
  this->Makefile->AddDefinition("CTEST_SCRIPT_DIRECTORY",
                                cmSystemTools::GetFilenamePath(script));
  this->Makefile->AddDefinition("CTEST_SCRIPT_NAME",
                                cmSystemTools::GetFilenameName(script));
  this->Makefile->AddDefinition("CTEST_EXECUTABLE_NAME",
                                cmSystemTools::GetCTestCommand());
  this->Makefile->AddDefinition("CMAKE_EXECUTABLE_NAME",
                                cmSystemTools::GetCMakeCommand());
  this->Makefile->AddDefinitionBool("CTEST_RUN_CURRENT_SCRIPT", true);
  this->SetRunCurrentScript(true);
  this->UpdateElapsedTime();

  // set the CTEST_CONFIGURATION_TYPE variable to the current value of the
  // the -C argument on the command line.
  if (!this->CTest->GetConfigType().empty()) {
    this->Makefile->AddDefinition("CTEST_CONFIGURATION_TYPE",
                                  this->CTest->GetConfigType());
  }

  // add the script arg if defined
  if (!script_arg.empty()) {
    this->Makefile->AddDefinition("CTEST_SCRIPT_ARG", script_arg);
  }

#if defined(__CYGWIN__)
  this->Makefile->AddDefinition("CMAKE_LEGACY_CYGWIN_WIN32", "0");
#endif

  // set a callback function to update the elapsed time
  this->Makefile->OnExecuteCommand([this] { this->UpdateElapsedTime(); });

  /* Execute CTestScriptMode.cmake, which loads CMakeDetermineSystem and
  CMakeSystemSpecificInformation, so
  that variables like CMAKE_SYSTEM and also the search paths for libraries,
  header and executables are set correctly and can be used. Makes new-style
  ctest scripting easier. */
  std::string systemFile =
    this->Makefile->GetModulesFile("CTestScriptMode.cmake");
  if (!this->Makefile->ReadListFile(systemFile) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error in read:" << systemFile << "\n");
    return 2;
  }

  // Add definitions of variables passed in on the command line:
  const std::map<std::string, std::string>& defs =
    this->CTest->GetDefinitions();
  for (auto const& d : defs) {
    this->Makefile->AddDefinition(d.first, d.second);
  }

  // finally read in the script
  if (!this->Makefile->ReadListFile(script) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    // Reset the error flag so that it can run more than
    // one script with an error when you use ctest_run_script.
    cmSystemTools::ResetErrorOccurredFlag();
    return 2;
  }

  return 0;
}